

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall format::mtx_error::~mtx_error(mtx_error *this)

{
  mtx_error *this_local;
  
  *(undefined ***)this = &PTR__mtx_error_00217668;
  std::__cxx11::string::~string((string *)&this->filename_);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

mtx_error (std::string filename, std::string msg="Error loading matrix")
  : std::runtime_error(msg)
  {
   filename_ = filename;
  }